

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

RepeatedField<bool> * __thiscall
google::protobuf::RepeatedField<bool>::operator=
          (RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  RepeatedField<bool> *this_00;
  RepeatedField<bool> *other_00;
  RepeatedField<bool> *in_RSI;
  RepeatedField<bool> *in_RDI;
  RepeatedField<bool> *in_stack_00000098;
  RepeatedField<bool> *in_stack_000000a0;
  RepeatedField<bool> *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    this_00 = (RepeatedField<bool> *)GetArena(in_stack_ffffffffffffffe0);
    other_00 = (RepeatedField<bool> *)GetArena(this_00);
    if (this_00 == other_00) {
      InternalSwap(in_stack_000000a0,in_stack_00000098);
    }
    else {
      CopyFrom(this_00,other_00);
    }
  }
  return in_RDI;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArena() != other.GetArena()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}